

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall QEvdevTabletHandler::readData(QEvdevTabletHandler *this)

{
  undefined1 auVar1 [16];
  qint64 qVar2;
  undefined8 uVar3;
  int *piVar4;
  input_event *in_RDI;
  long in_FS_OFFSET;
  int i;
  int result;
  int n;
  input_event buffer [32];
  char *in_stack_fffffffffffffca8;
  qint64 in_stack_fffffffffffffcb0;
  long *plVar5;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  int iVar6;
  int local_334;
  char local_328 [32];
  undefined1 local_308 [768];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_308,0xaa,0x300);
  local_334 = 0;
  do {
    while( true ) {
      qVar2 = qt_safe_read(in_stack_fffffffffffffcc4,in_RDI,in_stack_fffffffffffffcb0);
      iVar6 = (int)qVar2;
      if (iVar6 == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (char *)in_RDI,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                   in_stack_fffffffffffffca8);
        QtPrivate::asString((QString *)(in_RDI + 1));
        uVar3 = QString::utf16();
        QMessageLogger::warning(local_328,"evdevtablet: %ls: Got EOF from input device",uVar3);
        goto LAB_0010f88e;
      }
      if (iVar6 < 0) break;
      local_334 = iVar6 + local_334;
      if ((ulong)(long)local_334 % 0x18 == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_334;
        for (iVar6 = 0; iVar6 < SUB164(auVar1 / ZEXT816(0x18),0); iVar6 = iVar6 + 1) {
          QEvdevTabletData::processInputEvent
                    ((QEvdevTabletData *)CONCAT44(iVar6,in_stack_fffffffffffffcc0),in_RDI);
        }
LAB_0010f88e:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return;
      }
    }
    piVar4 = __errno_location();
  } while ((*piVar4 == 4) || (piVar4 = __errno_location(), *piVar4 == 0xb));
  QtPrivate::asString((QString *)(in_RDI + 1));
  uVar3 = QString::utf16();
  qErrnoWarning("evdevtablet: %ls: Could not read from input device",uVar3);
  piVar4 = __errno_location();
  if (*piVar4 == 0x13) {
    plVar5 = (long *)in_RDI[2].time.tv_sec;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x20))();
    }
    in_RDI[2].time.tv_sec = 0;
    qt_safe_close((int)((ulong)plVar5 >> 0x20));
    in_RDI->type = 0xffff;
    in_RDI->code = 0xffff;
  }
  goto LAB_0010f88e;
}

Assistant:

void QEvdevTabletHandler::readData()
{
    input_event buffer[32];
    int n = 0;
    for (; ;) {
        int result = QT_READ(m_fd, reinterpret_cast<char*>(buffer) + n, sizeof(buffer) - n);
        if (!result) {
            qWarning("evdevtablet: %ls: Got EOF from input device", qUtf16Printable(m_device));
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevtablet: %ls: Could not read from input device", qUtf16Printable(m_device));
                if (errno == ENODEV) { // device got disconnected -> stop reading
                    delete m_notifier;
                    m_notifier = 0;
                    QT_CLOSE(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(input_event) == 0)
                break;
        }
    }

    n /= sizeof(input_event);

    for (int i = 0; i < n; ++i)
        d->processInputEvent(&buffer[i]);
}